

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void xemmai::
     t_finalizes<xemmai::t_bears<xemmai::t_advanced_lambda<xemmai::t_lambda_shared>,_xemmai::t_type_of<xemmai::t_lambda_shared>_>_>
     ::f_do_finalize(t_object *a_this,t_scan a_scan)

{
  (*a_scan)(*(t_object **)a_this->v_data);
  (*a_scan)(*(t_object **)(a_this->v_data + 8));
  (*a_scan)(a_this[1].v_next);
  return;
}

Assistant:

void t_finalizes<T_base>::f_do_finalize(t_object* a_this, t_scan a_scan)
{
	using t = typename T_base::t_what;
	t_type_of<t>::f_do_scan(a_this, a_scan);
	a_this->f_as<t>().~t();
}